

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

_Bool check_frame(cio_websocket_frame_type opcode,char *payload,size_t payload_length,
                 _Bool is_last_frame)

{
  size_t sVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint8_t mask [4];
  uint_fast32_t aligned_mask;
  undefined4 local_24;
  ulong local_20;
  ulong __n;
  
  sVar1 = write_buffer_parse_pos + 1;
  bVar3 = write_buffer[write_buffer_parse_pos];
  if ((((opcode & ~(uint)bVar3) == CIO_WEBSOCKET_CONTINUATION_FRAME) &&
      (-1 < (char)bVar3 != is_last_frame)) && ((bVar3 & 0x70) == 0)) {
    lVar10 = write_buffer_parse_pos + 1;
    uVar7 = write_buffer[lVar10] & 0x7f;
    __n = (ulong)uVar7;
    if (__n == 0x7f) {
      __n = *(ulong *)(write_buffer + write_buffer_parse_pos + 2);
      sVar1 = write_buffer_parse_pos + 10;
    }
    else {
      sVar1 = write_buffer_parse_pos + 2;
      if (uVar7 == 0x7e) {
        __n = (ulong)*(ushort *)(write_buffer + write_buffer_parse_pos + 2);
        sVar1 = write_buffer_parse_pos + 4;
      }
    }
    write_buffer_parse_pos = sVar1;
    sVar1 = write_buffer_parse_pos;
    if (__n == payload_length) {
      if ((char)write_buffer[lVar10] < '\0') {
        puVar5 = write_buffer + write_buffer_parse_pos + 4;
        local_24 = *(undefined4 *)(write_buffer + write_buffer_parse_pos);
        sVar2 = write_buffer_parse_pos + 4;
        local_20 = 0;
        if (__n < 8) {
          write_buffer_parse_pos = sVar2;
          if (__n != 0) {
            uVar6 = 0;
            do {
              puVar5[uVar6] = puVar5[uVar6] ^ *(byte *)((long)&local_24 + (ulong)((uint)uVar6 & 3));
              uVar6 = uVar6 + 1;
            } while (__n != uVar6);
          }
        }
        else {
          uVar7 = -(int)puVar5 & 7;
          uVar9 = (ulong)uVar7;
          uVar6 = __n - uVar9;
          lVar10 = 0;
          do {
            *(undefined1 *)((long)&local_20 + lVar10) =
                 *(undefined1 *)
                  ((long)&local_24 +
                  (ulong)((-0x160c64 - (int)write_buffer_parse_pos) + (int)lVar10 & 3));
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          uVar8 = (ulong)((uint)uVar6 & 7);
          write_buffer_parse_pos = sVar2;
          if (uVar9 != 0) {
            lVar10 = 0;
            do {
              puVar5[lVar10] =
                   puVar5[lVar10] ^ *(byte *)((long)&local_24 + (ulong)((uint)lVar10 & 3));
              lVar10 = lVar10 + 1;
            } while (uVar7 != (uint)lVar10);
          }
          if (7 < uVar6) {
            uVar11 = 0;
            do {
              *(ulong *)(puVar5 + uVar11 * 8 + uVar9) =
                   *(ulong *)(puVar5 + uVar11 * 8 + uVar9) ^ local_20;
              uVar11 = uVar11 + 1;
            } while (uVar6 >> 3 != uVar11);
          }
          if (__n - uVar8 < __n) {
            lVar10 = -uVar8;
            do {
              write_buffer[lVar10 + sVar1 + __n + 4] =
                   write_buffer[lVar10 + sVar1 + __n + 4] ^
                   *(byte *)((long)&local_24 + (ulong)((int)__n + (int)lVar10 & 3));
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0);
          }
        }
      }
      if ((__n == 0) ||
         (iVar4 = bcmp(write_buffer + write_buffer_parse_pos,payload,__n),
         sVar1 = write_buffer_parse_pos, iVar4 == 0)) {
        write_buffer_parse_pos = write_buffer_parse_pos + payload_length;
        return true;
      }
    }
  }
  write_buffer_parse_pos = sVar1;
  return false;
}

Assistant:

static bool check_frame(enum cio_websocket_frame_type opcode, const char *payload, size_t payload_length, bool is_last_frame)
{
	uint8_t header = write_buffer[write_buffer_parse_pos++];
	if (((header & WS_HEADER_FIN) == WS_HEADER_FIN) != is_last_frame) {
		return false;
	}

	if ((header & WS_HEADER_RSV) != 0) {
		return false;
	}

	if ((header & opcode) != opcode) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;

	uint64_t length;
	if (first_length == 126) {
		uint16_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be16toh(len);
		length = len;
	} else if (first_length == 127) {
		uint64_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be64toh(len);
		length = len;
	} else {
		length = first_length;
	}

	if (length != payload_length) {
		return false;
	}

	if (is_masked) {
		uint8_t mask[4];
		memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
		write_buffer_parse_pos += sizeof(mask);
		cio_websocket_mask(&write_buffer[write_buffer_parse_pos], (size_t)length, mask);
	}

	if (length > SIZE_MAX) {
		return false;
	}

	if (length > 0) {
		if (memcmp(&write_buffer[write_buffer_parse_pos], payload, (size_t)length) != 0) {
			return false;
		}
	}

	write_buffer_parse_pos += payload_length;

	return true;
}